

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExprWriter.cpp
# Opt level: O2

void __thiscall ExprWriter::visit(ExprWriter *this,CallExpr *expr)

{
  string *__lhs;
  pointer ppEVar1;
  bool bVar2;
  bool bVar3;
  ret_type pCVar4;
  Expr *call;
  Expr *pEVar5;
  pointer ppEVar6;
  
  __lhs = &expr->funcName;
  bVar2 = std::operator==(__lhs,"va_start");
  bVar3 = true;
  if (!bVar2) {
    bVar3 = std::operator==(__lhs,"va_end");
  }
  pEVar5 = expr->funcValue;
  if (pEVar5 == (Expr *)0x0) {
    std::operator<<(this->ss,(string *)__lhs);
  }
  else {
    if (this->noFuncCasts == true) {
      while( true ) {
        pCVar4 = llvm::dyn_cast_or_null<CastExpr,Expr>(pEVar5);
        if (pCVar4 == (ret_type)0x0) break;
        pEVar5 = (pCVar4->super_UnaryExpr).expr;
      }
    }
    parensIfNotSimple(this,pEVar5);
  }
  std::operator<<(this->ss,"(");
  if (bVar3 != false) {
    std::operator<<(this->ss,"(void*)(");
  }
  ppEVar1 = (expr->params).super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  bVar2 = true;
  for (ppEVar6 = (expr->params).super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppEVar6 != ppEVar1; ppEVar6 = ppEVar6 + 1) {
    pEVar5 = *ppEVar6;
    if (bVar2) {
      (*pEVar5->_vptr_Expr[2])(pEVar5,this);
      if (bVar3 != false) {
        std::operator<<(this->ss,")");
      }
    }
    else {
      std::operator<<(this->ss,", ");
      (*pEVar5->_vptr_Expr[2])(pEVar5,this);
    }
    bVar2 = false;
  }
  std::operator<<(this->ss,")");
  return;
}

Assistant:

void ExprWriter::visit(CallExpr& expr) {
    bool isVaFunc = (expr.funcName == "va_start" || expr.funcName == "va_end");

    if (expr.funcValue) {
        auto call = expr.funcValue;

        if (noFuncCasts) {
            // strip all the casts
            while (auto CAST = llvm::dyn_cast_or_null<CastExpr>(call)) {
                call = CAST->expr;
            }
        }

        parensIfNotSimple(call);
    } else {
        ss << expr.funcName;
    }

    ss << "(";
    if (isVaFunc) {
        ss << "(void*)(";
    }

    bool first = true;
    for (auto param : expr.params) {
        if (first) {
            param->accept(*this);
            if (isVaFunc) {
                ss << ")";
            }

        } else {
            ss << ", ";
            param->accept(*this);
        }

        first = false;
    }

    ss << ")";
}